

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandComb(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nLatchesToAdd;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  int iVar4;
  uint local_44;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  local_44 = 0;
  Extra_UtilGetoptReset();
  nLatchesToAdd = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Llh"), iVar4 = globalUtilOptind, iVar1 != 0x4c) {
      if (iVar1 == -1) {
        if (pAVar2 != (Abc_Ntk_t *)0x0) {
          if ((pAVar2->nObjCounts[8] != 0 || nLatchesToAdd != 0) &&
             ((pAVar2->nObjCounts[8] == 0 || (nLatchesToAdd == 0)))) {
            pAVar2 = Abc_NtkDup(pAVar2);
            if (nLatchesToAdd == 0) {
              Abc_NtkMakeComb(pAVar2,local_44);
            }
            else {
              Abc_NtkMakeSeq(pAVar2,nLatchesToAdd);
            }
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
            return 0;
          }
          Abc_Print(-1,"The network is already combinational.\n");
          return 0;
        }
        pcVar3 = "Empty network.\n";
        iVar4 = -1;
        goto LAB_00227f61;
      }
      if (iVar1 != 0x6c) goto LAB_00227ef6;
      local_44 = local_44 ^ 1;
    }
    if (argc <= globalUtilOptind) break;
    nLatchesToAdd = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    if ((int)nLatchesToAdd < 0) {
LAB_00227ef6:
      iVar4 = -2;
      Abc_Print(-2,"usage: comb [-L <num>] [-lh]\n");
      Abc_Print(-2,"\t           converts comb network into seq, and vice versa\n");
      Abc_Print(-2,
                "\t-L <num> : number of latches to add to comb network (0 = do not add) [default = %d]\n"
                ,(ulong)nLatchesToAdd);
      pcVar3 = "remove";
      if (local_44 == 0) {
        pcVar3 = "convert";
      }
      Abc_Print(-2,
                "\t-l       : toggle converting latches to PIs/POs or removing them [default = %s]\n"
                ,pcVar3);
      pcVar3 = "\t-h       : print the command usage\n";
LAB_00227f61:
      Abc_Print(iVar4,pcVar3);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
  goto LAB_00227ef6;
}

Assistant:

int Abc_CommandComb( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    int fRemoveLatches;
    int nLatchesToAdd;
    extern void Abc_NtkMakeSeq( Abc_Ntk_t * pNtk, int nLatchesToAdd );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fRemoveLatches = 0;
    nLatchesToAdd = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Llh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLatchesToAdd = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLatchesToAdd < 0 )
                goto usage;
            break;
        case 'l':
            fRemoveLatches ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkIsComb(pNtk) && nLatchesToAdd == 0 )
    {
        Abc_Print( -1, "The network is already combinational.\n" );
        return 0;
    }
    if ( !Abc_NtkIsComb(pNtk) && nLatchesToAdd != 0 )
    {
        Abc_Print( -1, "The network is already combinational.\n" );
        return 0;
    }

    // get the new network
    pNtkRes = Abc_NtkDup( pNtk );
    if ( nLatchesToAdd )
        Abc_NtkMakeSeq( pNtkRes, nLatchesToAdd );
    else
        Abc_NtkMakeComb( pNtkRes, fRemoveLatches );
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: comb [-L <num>] [-lh]\n" );
    Abc_Print( -2, "\t           converts comb network into seq, and vice versa\n" );
    Abc_Print( -2, "\t-L <num> : number of latches to add to comb network (0 = do not add) [default = %d]\n", nLatchesToAdd );
    Abc_Print( -2, "\t-l       : toggle converting latches to PIs/POs or removing them [default = %s]\n", fRemoveLatches? "remove": "convert" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}